

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall Kvm::expandClauses(Kvm *this,Value *clauses)

{
  _func_int **pp_Var1;
  Value *pVVar2;
  KatException *this_00;
  Value *result1;
  Value *result2;
  GcGuard guard;
  
  if (this->NIL == clauses) {
    pVVar2 = this->FALSE;
  }
  else {
    pp_Var1 = clauses[1]._vptr_Value;
    pVVar2 = *(Value **)&clauses[1].type_;
    if ((Value *)pp_Var1[3] == this->ELSE) {
      if (pVVar2 == this->NIL) {
        pVVar2 = sequence(this,(Value *)pp_Var1[4]);
        return pVVar2;
      }
      this_00 = (KatException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&guard,"else clause isn\'t last",(allocator<char> *)&result1);
      anon_unknown.dwarf_e6eb::KatException::KatException(this_00,(string *)&guard);
      __cxa_throw(this_00,&(anonymous_namespace)::KatException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    result1 = (Value *)0x0;
    result2 = (Value *)0x0;
    guard.gc_ = &this->gc_;
    guard.times_ = 0;
    GcGuard::pushLocalStackRoot(&guard,&result1);
    GcGuard::pushLocalStackRoot(&guard,&result2);
    result1 = sequence(this,(Value *)pp_Var1[4]);
    result2 = expandClauses(this,pVVar2);
    pVVar2 = makeIf(this,(Value *)pp_Var1[3],result1,result2);
    result1 = pVVar2;
    GcGuard::~GcGuard(&guard);
  }
  return pVVar2;
}

Assistant:

const Value* Kvm::expandClauses(const Value *clauses)
{
    if (clauses == NIL)
    {
        return FALSE;
    } else
    {
        auto first = car(clauses);
        auto rest  = cdr(clauses);
        if (isCondElseClause(first))
        {
            if (rest == NIL)
            {
                 return sequence(condActions(first));
            } else
            {
                throw KatException("else clause isn't last");
            }
        } else
        {
            const Value *result1 = nullptr;
            const Value *result2 = nullptr;
            GcGuard guard{gc_};
            guard.pushLocalStackRoot(&result1);
            guard.pushLocalStackRoot(&result2);

            result1 = sequence(condActions(first));
            result2 = expandClauses(rest);
            result1 = makeIf(condPredicate(first), result1, result2);
            return result1;
        }
    }
}